

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::Divide
          (TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
           *this,TPZVec<TPZGeoEl_*> *SubElVec)

{
  TPZReference *pTVar1;
  _func_int *p_Var2;
  _Base_ptr p_Var3;
  TPZVec<TPZGeoEl_*> *pTVar4;
  uint uVar5;
  MElementType elType;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  undefined4 uVar11;
  ostream *poVar12;
  TPZGeoEl *pTVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  long *plVar17;
  TPZGeoEl *pTVar18;
  TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_> *pTVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  TPZManVector<long,_30> *pTVar24;
  TPZGeoElSide neighbour;
  TPZAutoPointer<TPZRefPattern> local_280;
  TPZVec<TPZGeoEl_*> *local_278;
  TPZGeoElSide gs;
  int64_t index;
  TPZAutoPointer<TPZRefPattern> uniform;
  TPZGeoEl *local_248;
  int local_240;
  TPZManVector<long,_30> np;
  
  pTVar1 = (this->fRefPattern).fRef;
  if ((pTVar1 != (TPZReference *)0x0) && (pTVar1->fPointer != (TPZRefPattern *)0x0))
  goto LAB_00f11c05;
  elType = (**(code **)(*(long *)&(this->
                                  super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                  ).super_TPZGeoEl + 0xb8))(this);
  if (elType == EPoint) {
    return;
  }
  TPZRefPatternDataBase::GetUniformRefPattern((TPZRefPatternDataBase *)&np,0x1877ba0);
  if (np.super_TPZVec<long>._vptr_TPZVec == (_func_int **)0x0) {
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)&np);
LAB_00f11b05:
    TPZRefPatternDataBase::InitializeUniformRefPattern(&gRefDBase,elType);
  }
  else {
    p_Var2 = *np.super_TPZVec<long>._vptr_TPZVec;
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)&np);
    if (p_Var2 == (_func_int *)0x0) goto LAB_00f11b05;
  }
  TPZRefPatternDataBase::GetUniformRefPattern((TPZRefPatternDataBase *)&uniform,0x1877ba0);
  np.super_TPZVec<long>.fNElements = 0;
  np.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&np;
  np.super_TPZVec<long>.fStore = (long *)&np;
  TPZRefPatternTools::GetCompatibleRefPatterns
            ((TPZGeoEl *)this,
             (list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> *
             )&np);
  pTVar24 = &np;
  do {
    while( true ) {
      while( true ) {
        pTVar24 = *(TPZManVector<long,_30> **)
                   &(((map<MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>,_std::less<MElementType>,_std::allocator<std::pair<const_MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>_>_>_>
                       *)&pTVar24->super_TPZVec<long>)->_M_t)._M_impl;
        if (pTVar24 == &np) {
          poVar12 = std::operator<<((ostream *)&std::cerr,
                                    "TPZGeoElRefPattern<TGeo>::Divide ERROR : Undefined Refinement Pattern!"
                                   );
          std::endl<char,std::char_traits<char>>(poVar12);
          (*SubElVec->_vptr_TPZVec[3])(SubElVec,0);
          goto LAB_00f11bdf;
        }
        p_Var3 = (((map<MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>,_std::less<MElementType>,_std::allocator<std::pair<const_MElementType,_std::__cxx11::list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>_>_>_>
                    *)&pTVar24->super_TPZVec<long>)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                 _M_parent;
        if (p_Var3 != (_Base_ptr)0x0) break;
        if ((uniform.fRef == (TPZReference *)0x0) ||
           ((uniform.fRef)->fPointer == (TPZRefPattern *)0x0)) goto LAB_00f11b93;
      }
      lVar14 = *(long *)p_Var3;
      if (uniform.fRef == (TPZReference *)0x0) break;
      if (((uniform.fRef)->fPointer != (TPZRefPattern *)0x0) == (lVar14 != 0)) goto LAB_00f11b93;
    }
  } while (lVar14 != 0);
LAB_00f11b93:
  local_280.fRef = uniform.fRef;
  LOCK();
  ((uniform.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((uniform.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (**(code **)(*(long *)&(this->
                         super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                         ).super_TPZGeoEl + 0x2a8))(this);
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&local_280);
LAB_00f11bdf:
  std::__cxx11::
  _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
  _M_clear((_List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
            *)&np);
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&uniform);
  if (pTVar24 == &np) {
    return;
  }
LAB_00f11c05:
  (**(code **)(*(long *)&(this->
                         super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                         ).super_TPZGeoEl + 0x2b0))(&np,this);
  uVar6 = TPZRefPattern::NSubElements((TPZRefPattern *)*np.super_TPZVec<long>._vptr_TPZVec);
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)&np);
  iVar7 = (**(code **)(*(long *)&(this->
                                 super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                 ).super_TPZGeoEl + 0x1d0))(this);
  if (iVar7 == 0) {
    iVar7 = (this->
            super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>)
            .super_TPZGeoEl.fMatId;
    (**(code **)(*(long *)&(this->
                           super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                           ).super_TPZGeoEl + 0x2b0))(&np,this);
    iVar8 = TPZRefPattern::NNodes((TPZRefPattern *)*np.super_TPZVec<long>._vptr_TPZVec);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)&np);
    uniform.fRef = (TPZReference *)0x0;
    TPZManVector<long,_30>::TPZManVector(&np,(long)iVar8,(long *)&uniform);
    iVar8 = (**(code **)(*(long *)&(this->
                                   super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                   ).super_TPZGeoEl + 0x98))(this);
    iVar23 = 0;
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    local_278 = SubElVec;
    for (; iVar8 != iVar23; iVar23 = iVar23 + 1) {
      lVar14 = (**(code **)(*(long *)&(this->
                                      super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                      ).super_TPZGeoEl + 0xa8))(this,iVar23);
      (**(code **)(*(long *)&(this->
                             super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                             ).super_TPZGeoEl + 0x2b0))(&uniform);
      pTVar13 = TPZRefPattern::Element((uniform.fRef)->fPointer,0);
      lVar15 = (**(code **)(*(long *)pTVar13 + 0xa8))(pTVar13,iVar23);
      np.super_TPZVec<long>.fStore[lVar15] = lVar14;
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&uniform);
    }
    (**(code **)(*(long *)&(this->
                           super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                           ).super_TPZGeoEl + 0x2b0))(&uniform,this);
    TPZRefPattern::CreateNewNodes((uniform.fRef)->fPointer,(TPZGeoEl *)this,&np.super_TPZVec<long>);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&uniform);
    uVar9 = 0;
    if (0 < (int)uVar6) {
      uVar9 = uVar6;
    }
    uVar5 = 0;
    while (pTVar4 = local_278, uVar5 != uVar9) {
      (**(code **)(*(long *)&(this->
                             super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                             ).super_TPZGeoEl + 0x2b0))((TPZManVector<long,_30> *)&uniform);
      uVar22 = uVar5 + 1;
      pTVar13 = TPZRefPattern::Element((uniform.fRef)->fPointer,uVar22);
      uVar10 = (**(code **)(*(long *)pTVar13 + 0x98))(pTVar13);
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&uniform);
      TPZManVector<long,_30>::TPZManVector((TPZManVector<long,_30> *)&uniform,(long)(int)uVar10);
      if ((int)uVar10 < 1) {
        uVar10 = 0;
      }
      for (uVar21 = 0; uVar10 != uVar21; uVar21 = uVar21 + 1) {
        (**(code **)(*(long *)&(this->
                               super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                               ).super_TPZGeoEl + 0x2b0))(&neighbour);
        pTVar13 = TPZRefPattern::Element
                            ((TPZRefPattern *)*neighbour.super_TPZSavable._vptr_TPZSavable,uVar22);
        lVar14 = (**(code **)(*(long *)pTVar13 + 0xa8))(pTVar13,uVar21 & 0xffffffff);
        TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)&neighbour);
        *(long *)(&local_248->field_0x0 + uVar21 * 8) = np.super_TPZVec<long>.fStore[lVar14];
      }
      (**(code **)(*(long *)&(this->
                             super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                             ).super_TPZGeoEl + 0x2b0))(&neighbour);
      pTVar13 = TPZRefPattern::Element
                          ((TPZRefPattern *)*neighbour.super_TPZSavable._vptr_TPZSavable,uVar22);
      uVar11 = (**(code **)(*(long *)pTVar13 + 0xb8))(pTVar13);
      uVar16 = (**(code **)(*(long *)&(this->
                                      super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                      ).super_TPZGeoEl + 0x168))
                         (this,uVar11,(TPZManVector<long,_30> *)&uniform,iVar7,&index);
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)&neighbour);
      (**(code **)(*(long *)&(this->
                             super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                             ).super_TPZGeoEl + 0x1b0))(this,uVar5,uVar16);
      TPZManVector<long,_30>::~TPZManVector((TPZManVector<long,_30> *)&uniform);
      uVar5 = uVar22;
    }
    (*local_278->_vptr_TPZVec[3])(local_278,(long)(int)uVar6);
    for (uVar21 = 0; uVar9 != uVar21; uVar21 = uVar21 + 1) {
      pTVar13 = (TPZGeoEl *)
                (**(code **)(*(long *)&(this->
                                       super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                       ).super_TPZGeoEl + 0x1f8))(this,uVar21 & 0xffffffff);
      pTVar4->fStore[uVar21] = pTVar13;
      pTVar13 = pTVar4->fStore[uVar21];
      pTVar13->fFatherIndex =
           (this->
           super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>).
           super_TPZGeoEl.fIndex;
      (**(code **)(*(long *)pTVar13 + 0x1f0))();
    }
    uVar5 = 0;
    while (uVar10 = uVar5, uVar10 != uVar9) {
      (**(code **)(*(long *)&(this->
                             super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                             ).super_TPZGeoEl + 0x2b0))(&uniform,this);
      pTVar13 = TPZRefPattern::Element((uniform.fRef)->fPointer,uVar10 + 1);
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&uniform);
      for (iVar7 = 0; iVar8 = (**(code **)(*(long *)pTVar13 + 0xf0))(pTVar13), uVar5 = uVar10 + 1,
          iVar7 < iVar8; iVar7 = iVar7 + 1) {
        (**(code **)(*(long *)pTVar13 + 0x188))(&uniform,pTVar13,iVar7);
        if ((local_240 < 0 || local_248 == (TPZGeoEl *)0x0) ||
           (local_248 == pTVar13 && local_240 == iVar7)) {
          plVar17 = (long *)(**(code **)(*(long *)&(this->
                                                  super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                                  ).super_TPZGeoEl + 0x1f8))(this,uVar10);
          neighbour.fGeoEl =
               (TPZGeoEl *)
               (**(code **)(*(long *)&(this->
                                      super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                      ).super_TPZGeoEl + 0x1f8))(this,uVar10);
          neighbour.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
          neighbour.fSide = iVar7;
          (**(code **)(*plVar17 + 0x198))(plVar17,iVar7,&neighbour);
        }
        else {
          uVar5 = 0xffffffff;
          do {
            uVar22 = uVar5;
            if (uVar6 == uVar22) goto LAB_00f12057;
            (**(code **)(*(long *)&(this->
                                   super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                   ).super_TPZGeoEl + 0x2b0))(&neighbour,this);
            pTVar18 = TPZRefPattern::Element
                                ((TPZRefPattern *)*neighbour.super_TPZSavable._vptr_TPZSavable,
                                 uVar22 + 1);
            TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                      ((TPZAutoPointer<TPZRefPattern> *)&neighbour);
            uVar5 = uVar22 + 1;
          } while (uVar10 == uVar22 || pTVar18 != local_248);
          neighbour.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
          neighbour.fGeoEl = (TPZGeoEl *)0x0;
          neighbour.fSide = -1;
          pTVar19 = this;
          if (uVar22 != 0xffffffff) {
            pTVar19 = (TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                       *)(**(code **)(*(long *)&(this->
                                                super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                                ).super_TPZGeoEl + 0x1f8))(this,uVar22);
          }
          neighbour.fSide = local_240;
          neighbour.fGeoEl = (TPZGeoEl *)pTVar19;
          gs.fGeoEl = (TPZGeoEl *)
                      (**(code **)(*(long *)&(this->
                                             super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                             ).super_TPZGeoEl + 0x1f8))(this,uVar10);
          gs.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
          gs.fSide = iVar7;
          iVar8 = TPZGeoElSide::NeighbourExists(&gs,&neighbour);
          if (iVar8 == 0) {
            TPZGeoElSide::SetConnectivity(&gs,&neighbour);
          }
        }
LAB_00f12057:
      }
    }
    (**(code **)(*(long *)&(this->
                           super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                           ).super_TPZGeoEl + 0x1b8))(this);
    TPZManVector<long,_30>::~TPZManVector(&np);
  }
  else {
    (*SubElVec->_vptr_TPZVec[3])(SubElVec,(long)(int)uVar6);
    uVar20 = 0;
    uVar21 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar21 = uVar20;
    }
    for (; uVar21 != uVar20; uVar20 = uVar20 + 1) {
      pTVar13 = (TPZGeoEl *)
                (**(code **)(*(long *)&(this->
                                       super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                       ).super_TPZGeoEl + 0x1f8))(this,uVar20 & 0xffffffff);
      SubElVec->fStore[uVar20] = pTVar13;
    }
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Divide(TPZVec<TPZGeoEl *> &SubElVec){
	if (!fRefPattern) {
		MElementType typeel = this->Type();
		if(typeel == EPoint)
			return;
		if(!gRefDBase.GetUniformRefPattern(typeel))
		{
			gRefDBase.InitializeUniformRefPattern(typeel);
		}
		TPZAutoPointer<TPZRefPattern> uniform = gRefDBase.GetUniformRefPattern(typeel);
		std::list<TPZAutoPointer<TPZRefPattern> > compat;
		TPZRefPatternTools::GetCompatibleRefPatterns(this,compat);
		std::list<TPZAutoPointer<TPZRefPattern> >::iterator it = compat.begin();
		while(it != compat.end()){
			if(*it == uniform) break;
			it++;
		}
		if(it != compat.end())
		{
			this->SetRefPattern(uniform);
		}
		else
		{
			PZError << "TPZGeoElRefPattern<TGeo>::Divide ERROR : Undefined Refinement Pattern!" << std::endl;
			SubElVec.Resize(0);
			return;
		}
	}
	int i;
	int NSubEl = this->GetRefPattern()->NSubElements();
	if(HasSubElement()) {
		SubElVec.Resize(NSubEl);
		for(i=0;i<NSubEl;i++) SubElVec[i] = SubElement(i);
#ifdef PZ_LOG
        TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
        if(loggerrefpattern.isWarnEnabled())
		{
			std::stringstream sout;
			sout << "Trying to divide element which has subelements " << this->Index() << std::endl;
			sout << "Subelement indices ";
			for(i=0; i<NSubEl; i++) sout << SubElVec[i]->Index() << " ";
			LOGPZ_WARN(loggerrefpattern,sout.str());
		}
#endif
		return;//If exist fSubEl return this sons
	}
	int64_t index;
	int j, k, sub, matid=this->MaterialId();
	
	int64_t totalnodes = this->GetRefPattern()->NNodes();
	TPZManVector<int64_t,30> np(totalnodes,0);
	int nnodes = this->NCornerNodes();
	
	for(j=0;j<nnodes;j++) {
		np[this->GetRefPattern()->Element(0)->NodeIndex(j)] = this->NodeIndex(j);
	}
	this->GetRefPattern()->CreateNewNodes (this, np);
	//std::cout << "NewNodeIndexes : " << np << std::endl;
	
	// creating new subelements
	for(i=0;i<NSubEl;i++) {
		int subcorner = this->GetRefPattern()->Element(i+1)->NCornerNodes();
		TPZManVector<int64_t,30> cornerindexes(subcorner);
		for(j=0;j<subcorner;j++) {
			int64_t cornerid = this->GetRefPattern()->Element(i+1)->NodeIndex(j);
			cornerindexes[j] = np[cornerid];
		}
		//std::cout << "Subel corner " << cornerindexes << std::endl;
		TPZGeoEl *subel = this->CreateGeoElement((MElementType)this->GetRefPattern()->Element(i+1)->Type(),cornerindexes,matid,index);
		SetSubElement(i,subel);
	}
	
	SubElVec.Resize(NSubEl);
	for(sub=0;sub<NSubEl;sub++) {
		SubElVec[sub] = SubElement(sub);
		SubElVec[sub]->SetFather(this);
		SubElVec[sub]->SetFatherIndex(this->fIndex);
	}

	for(i=0;i<NSubEl;i++) {
		//std::cout << "SubElement " << i << std::endl;
		TPZGeoEl *refsubel = this->GetRefPattern()->Element(i+1);
		for (j=0;j<refsubel->NSides();j++){
			//std::cout << "\t Side " << j << std::endl;
			TPZGeoElSide thisside (refsubel,j);
			TPZGeoElSide refneigh = refsubel->Neighbour(j);
			if(refneigh.Exists() && refneigh != thisside) {
				//como nao me deixam guardar o index do elemento geometrico...
				for (k=0;k<NSubEl+1;k++){
					if (this->GetRefPattern()->Element(k) == refneigh.Element() && k-1 != i){
						//    std::cout << "\t\t\tFound subel " << k << "  side of subel " << refneigh.Side()
						//      << "For subelement " << i << " side " << j << std::endl;
						TPZGeoElSide neighbour;
						if(k) {
							neighbour = TPZGeoElSide(SubElement(k-1),refneigh.Side());
						} else {
							neighbour = TPZGeoElSide(this, refneigh.Side());
						}
						TPZGeoElSide gs(SubElement(i),j);
						if(!gs.NeighbourExists(neighbour)) gs.SetConnectivity(neighbour);
						break;
					}
				}
				if(k == NSubEl+1) {
					//std::cout << "TPZGeoElRefPattern<TGeo>::Divide inconsistent datastructure subelement "
					//  << i << " Side " << j << std::endl;
				}
			} else {
				SubElement(i)->SetNeighbour(j,TPZGeoElSide(SubElement(i),j));
			}
		}
	}
	
	this->SetSubElementConnectivities();
#ifdef PZ_LOG
    {
        TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
        if (loggerrefpattern.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "Dividing element " << this->Index() << std::endl;
            sout << "Subelement indices ";
            for(i=0; i<NSubEl; i++) sout << SubElVec[i]->Index() << " ";
            LOGPZ_DEBUG(loggerrefpattern,sout.str())
        }
    }
#endif
}